

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerSafe::Petition::anon_class_80_4_b999da52::operator()
          (anon_class_80_4_b999da52 *this)

{
  element_type *peVar1;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
  local_30;
  anon_class_80_4_b999da52 *local_10;
  anon_class_80_4_b999da52 *this_local;
  
  local_10 = this;
  peVar1 = std::
           __shared_ptr_access<ot::commissioner::CommissionerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::CommissionerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->this->mImpl);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
  ::function(&local_30,&this->aHandler);
  (*(peVar1->super_Commissioner)._vptr_Commissioner[0xd])
            (peVar1,&local_30,&this->aAddr,(ulong)this->aPort);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
  ::~function(&local_30);
  return;
}

Assistant:

Error CommissionerSafe::Petition(std::string &aExistingCommissionerId, const std::string &aAddr, uint16_t aPort)
{
    std::promise<Error> pro;
    auto wait = [&pro, &aExistingCommissionerId](const std::string *existingCommissionerId, Error error) {
        if (existingCommissionerId != nullptr)
        {
            aExistingCommissionerId = *existingCommissionerId;
        }
        pro.set_value(error);
    };

    Petition(wait, aAddr, aPort);
    return pro.get_future().get();
}